

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall
cmake::SetArgs(cmake *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args,bool directoriesSetBefore)

{
  bool bVar1;
  int iVar2;
  pointer pbVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  cmGlobalGenerator *gg;
  undefined8 uVar6;
  char *__s;
  size_t sVar7;
  ulong uVar8;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 collapse;
  undefined7 in_register_00000011;
  uint uVar9;
  string *psVar10;
  ulong uVar11;
  bool bVar12;
  string value;
  string local_c0;
  uint local_9c;
  ulong local_98;
  ulong local_90;
  string local_88;
  string *local_68;
  string *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  uVar11 = CONCAT71(in_register_00000011,directoriesSetBefore);
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar12 = 0x20 < (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3);
  if (bVar12) {
    local_9c = (uint)uVar11;
    local_68 = (string *)&this->GeneratorToolset;
    local_60 = (string *)&this->GeneratorPlatform;
    local_58 = &this->TraceOnlyThisSources;
    local_50 = (string *)&this->GraphVizFile;
    local_48 = (string *)&this->CheckStampList;
    local_40 = (string *)&this->CheckStampFile;
    local_38 = (string *)&this->CheckBuildSystemArgument;
    uVar11 = 1;
    local_98 = 0;
    local_90 = 0;
    do {
      uVar9 = (uint)uVar11;
      pbVar3 = pbVar3 + uVar11;
      lVar4 = std::__cxx11::string::find((char *)pbVar3,0x56778a,0);
      if (lVar4 == 0) {
        std::__cxx11::string::substr((ulong)&local_c0,(ulong)pbVar3);
        cmsys::SystemTools::CollapseFullPath(&local_88,&local_c0);
        std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        cmsys::SystemTools::ConvertToUnixSlashes(&local_c0);
        SetHomeDirectory(this,&local_c0);
LAB_0027b1ea:
        paVar5 = &local_c0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar5) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          paVar5 = extraout_RAX_00;
        }
LAB_0027b206:
        local_9c = (uint)CONCAT71((int7)((ulong)paVar5 >> 8),1);
LAB_0027b20c:
        bVar1 = true;
      }
      else {
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x55924d,0);
        if ((lVar4 == 0) ||
           (lVar4 = std::__cxx11::string::find((char *)pbVar3,0x559250,0), lVar4 == 0))
        goto LAB_0027b20c;
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x56778e,0);
        if (lVar4 == 0) {
          std::__cxx11::string::substr((ulong)&local_c0,(ulong)pbVar3);
          cmsys::SystemTools::CollapseFullPath(&local_88,&local_c0);
          std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&local_c0);
          SetHomeOutputDirectory(this,&local_c0);
          goto LAB_0027b1ea;
        }
        if ((uVar11 < ((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5) - 2U) &&
           (lVar4 = std::__cxx11::string::find((char *)pbVar3,0x559253,0), lVar4 == 0)) {
          std::__cxx11::string::_M_assign(local_38);
          uVar9 = uVar9 + 2;
          iVar2 = atoi((args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_dataplus._M_p);
          this->ClearBuildSystem = 0 < iVar2;
          goto LAB_0027b20c;
        }
        if (((uVar11 < ((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) &&
            (lVar4 = std::__cxx11::string::find((char *)pbVar3,0x559268,0), psVar10 = local_40,
            lVar4 == 0)) ||
           ((uVar11 < ((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U &&
            (lVar4 = std::__cxx11::string::find((char *)pbVar3,0x55927b,0), psVar10 = local_48,
            lVar4 == 0)))) {
          uVar9 = uVar9 + 1;
          std::__cxx11::string::_M_assign(psVar10);
          goto LAB_0027b20c;
        }
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x558fdb,0);
        if (((lVar4 == 0) ||
            (lVar4 = std::__cxx11::string::find((char *)pbVar3,0x5590dd,0), lVar4 == 0)) ||
           (lVar4 = std::__cxx11::string::find((char *)pbVar3,0x5590fe,0), lVar4 == 0))
        goto LAB_0027b20c;
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x559141,0);
        if ((lVar4 == 0) ||
           (lVar4 = std::__cxx11::string::find((char *)pbVar3,0x559168,0), lVar4 == 0)) {
          uVar9 = uVar9 + 1;
          goto LAB_0027b20c;
        }
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x55908f,0);
        if (lVar4 == 0) goto LAB_0027b20c;
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x55928e,0);
        if (lVar4 == 0) {
          std::__cxx11::string::substr((ulong)&local_c0,(ulong)pbVar3);
          cmsys::SystemTools::CollapseFullPath(&local_88,&local_c0);
          std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&local_c0);
          std::__cxx11::string::_M_assign(local_50);
          if ((this->GraphVizFile)._M_string_length == 0) {
            cmSystemTools::Error
                      ("No file specified for --graphviz",(char *)0x0,(char *)0x0,(char *)0x0);
          }
LAB_0027b3bf:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0027b20c;
        }
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x5592bb,0);
        if (lVar4 == 0) {
          std::__cxx11::string::substr((ulong)&local_c0,(ulong)pbVar3);
          SetupDebugger(this,&local_c0);
          goto LAB_0027b3bf;
        }
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x5592c7,0);
        if (lVar4 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"debug trycompile on\n",0x14);
          this->DebugTryCompile = true;
          goto LAB_0027b20c;
        }
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x5592ef,0);
        if (lVar4 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Running with debug output on.\n",0x1e);
          this->DebugOutput = true;
          goto LAB_0027b20c;
        }
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x55931d,0);
        if (lVar4 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Running with expanded trace output on.\n",0x27);
          this->Trace = true;
          this->TraceExpand = true;
          goto LAB_0027b20c;
        }
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x559354,0);
        if (lVar4 == 0) {
          std::__cxx11::string::substr((ulong)&local_c0,(ulong)pbVar3);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_c0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_58,&local_c0);
          this->Trace = true;
          goto LAB_0027b3bf;
        }
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x559364,0);
        if (lVar4 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Running with trace output on.\n",0x1e);
          this->Trace = true;
          this->TraceExpand = false;
          goto LAB_0027b20c;
        }
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x55938b,0);
        if (lVar4 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Warn about uninitialized values.\n",0x21);
          this->WarnUninitialized = true;
          goto LAB_0027b20c;
        }
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x5593c2,0);
        if (lVar4 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Finding unused variables.\n",0x1a);
          this->WarnUnused = true;
          goto LAB_0027b20c;
        }
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x5593f0,0);
        if (lVar4 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Not searching for unused variables given on the ",0x30);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"command line.\n",0xe);
          this->WarnUnusedCli = false;
          goto LAB_0027b20c;
        }
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x559445,0);
        if (lVar4 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Also check system files when warning about unused and ",
                     0x36);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"uninitialized variables.\n",0x19);
          this->CheckSystemVars = true;
          goto LAB_0027b20c;
        }
        lVar4 = std::__cxx11::string::find((char *)pbVar3,0x5594c4,0);
        if (lVar4 == 0) {
          std::__cxx11::string::substr((ulong)&local_c0,(ulong)pbVar3);
          if (local_c0._M_string_length == 0) {
            uVar9 = uVar9 + 1;
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar9) {
              bVar1 = false;
              cmSystemTools::Error
                        ("No platform specified for -A",(char *)0x0,(char *)0x0,(char *)0x0);
              goto LAB_0027b76f;
            }
            std::__cxx11::string::_M_assign((string *)&local_c0);
          }
          if ((local_90 & 1) == 0) {
            bVar1 = true;
            uVar6 = std::__cxx11::string::_M_assign(local_60);
            local_90 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
          }
          else {
            bVar1 = false;
            cmSystemTools::Error
                      ("Multiple -A options not allowed",(char *)0x0,(char *)0x0,(char *)0x0);
          }
LAB_0027b76f:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if (bVar1) goto LAB_0027b20c;
        }
        else {
          lVar4 = std::__cxx11::string::find((char *)pbVar3,0x559500,0);
          if (lVar4 == 0) {
            std::__cxx11::string::substr((ulong)&local_c0,(ulong)pbVar3);
            if (local_c0._M_string_length == 0) {
              uVar9 = uVar9 + 1;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar9) {
                bVar1 = false;
                cmSystemTools::Error
                          ("No toolset specified for -T",(char *)0x0,(char *)0x0,(char *)0x0);
                goto LAB_0027b76f;
              }
              std::__cxx11::string::_M_assign((string *)&local_c0);
            }
            if ((local_98 & 1) == 0) {
              bVar1 = true;
              uVar6 = std::__cxx11::string::_M_assign(local_68);
              local_98 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
            }
            else {
              bVar1 = false;
              cmSystemTools::Error
                        ("Multiple -T options not allowed",(char *)0x0,(char *)0x0,(char *)0x0);
            }
            goto LAB_0027b76f;
          }
          lVar4 = std::__cxx11::string::find((char *)pbVar3,0x55953e,0);
          if (lVar4 != 0) {
            SetDirectoriesFromFile(this,(pbVar3->_M_dataplus)._M_p);
            paVar5 = extraout_RAX;
            goto LAB_0027b206;
          }
          std::__cxx11::string::substr((ulong)&local_c0,(ulong)pbVar3);
          if (local_c0._M_string_length == 0) {
            uVar9 = uVar9 + 1;
            if ((ulong)uVar9 <
                (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5)) {
              std::__cxx11::string::_M_assign((string *)&local_c0);
              goto LAB_0027b6de;
            }
            cmSystemTools::Error
                      ("No generator specified for -G",(char *)0x0,(char *)0x0,(char *)0x0);
            PrintGeneratorList(this);
            bVar1 = false;
          }
          else {
LAB_0027b6de:
            gg = CreateGlobalGenerator(this,&local_c0);
            if (gg == (cmGlobalGenerator *)0x0) {
              cmSystemTools::Error
                        ("Could not create named generator ",local_c0._M_dataplus._M_p,(char *)0x0,
                         (char *)0x0);
              bVar1 = true;
              PrintGeneratorList(this);
            }
            else {
              bVar1 = true;
              SetGlobalGenerator(this,gg);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if (bVar1) goto LAB_0027b20c;
        }
        bVar1 = false;
      }
      if (!bVar1) break;
      uVar11 = (ulong)(uVar9 + 1);
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5;
      bVar12 = uVar11 < uVar8;
    } while (uVar11 < uVar8);
    uVar11 = (ulong)local_9c;
  }
  if (!bVar12) {
    if ((uVar11 & 1) == 0) {
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                (&local_c0,(SystemTools *)0x1,SUB81(uVar11,0));
      SetHomeOutputDirectory(this,&local_c0);
      collapse = extraout_DL;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        collapse = extraout_DL_00;
      }
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                (&local_c0,(SystemTools *)0x1,(bool)collapse);
      SetHomeDirectory(this,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    __s = getenv("CMAKE_DEBUGGER");
    if ((__s != (char *)0x0) && (*__s != '\0')) {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      sVar7 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,__s,__s + sVar7);
      SetupDebugger(this,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void cmake::SetArgs(const std::vector<std::string>& args,
                    bool directoriesSetBefore)
{
  bool directoriesSet = directoriesSetBefore;
  bool haveToolset = false;
  bool havePlatform = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-H", 0) == 0) {
      directoriesSet = true;
      std::string path = arg.substr(2);
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeDirectory(path);
    } else if (arg.find("-S", 0) == 0) {
      // There is no local generate anymore.  Ignore -S option.
    } else if (arg.find("-O", 0) == 0) {
      // There is no local generate anymore.  Ignore -O option.
    } else if (arg.find("-B", 0) == 0) {
      directoriesSet = true;
      std::string path = arg.substr(2);
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeOutputDirectory(path);
    } else if ((i < args.size() - 2) &&
               (arg.find("--check-build-system", 0) == 0)) {
      this->CheckBuildSystemArgument = args[++i];
      this->ClearBuildSystem = (atoi(args[++i].c_str()) > 0);
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-file", 0) == 0)) {
      this->CheckStampFile = args[++i];
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-list", 0) == 0)) {
      this->CheckStampList = args[++i];
    }
#if defined(CMAKE_HAVE_VS_GENERATORS)
    else if ((i < args.size() - 1) &&
             (arg.find("--vs-solution-file", 0) == 0)) {
      this->VSSolutionFile = args[++i];
    }
#endif
    else if (arg.find("-D", 0) == 0) {
      // skip for now
    } else if (arg.find("-U", 0) == 0) {
      // skip for now
    } else if (arg.find("-C", 0) == 0) {
      // skip for now
    } else if (arg.find("-P", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("--find-package", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("-W", 0) == 0) {
      // skip for now
    } else if (arg.find("--graphviz=", 0) == 0) {
      std::string path = arg.substr(strlen("--graphviz="));
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->GraphVizFile = path;
      if (this->GraphVizFile.empty()) {
        cmSystemTools::Error("No file specified for --graphviz");
      }
#if defined(HAVE_DEBUG_SERVER)
    } else if (arg.find("--debugger=", 0) == 0) {
      std::string connection = arg.substr(strlen("--debugger="));
      SetupDebugger(connection);
#endif
    } else if (arg.find("--debug-trycompile", 0) == 0) {
      std::cout << "debug trycompile on\n";
      this->DebugTryCompileOn();
    } else if (arg.find("--debug-output", 0) == 0) {
      std::cout << "Running with debug output on.\n";
      this->SetDebugOutputOn(true);
    } else if (arg.find("--trace-expand", 0) == 0) {
      std::cout << "Running with expanded trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(true);
    } else if (arg.find("--trace-source=", 0) == 0) {
      std::string file = arg.substr(strlen("--trace-source="));
      cmSystemTools::ConvertToUnixSlashes(file);
      this->AddTraceSource(file);
      this->SetTrace(true);
    } else if (arg.find("--trace", 0) == 0) {
      std::cout << "Running with trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(false);
    } else if (arg.find("--warn-uninitialized", 0) == 0) {
      std::cout << "Warn about uninitialized values.\n";
      this->SetWarnUninitialized(true);
    } else if (arg.find("--warn-unused-vars", 0) == 0) {
      std::cout << "Finding unused variables.\n";
      this->SetWarnUnused(true);
    } else if (arg.find("--no-warn-unused-cli", 0) == 0) {
      std::cout << "Not searching for unused variables given on the "
                << "command line.\n";
      this->SetWarnUnusedCli(false);
    } else if (arg.find("--check-system-vars", 0) == 0) {
      std::cout << "Also check system files when warning about unused and "
                << "uninitialized variables.\n";
      this->SetCheckSystemVars(true);
    } else if (arg.find("-A", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No platform specified for -A");
          return;
        }
        value = args[i];
      }
      if (havePlatform) {
        cmSystemTools::Error("Multiple -A options not allowed");
        return;
      }
      this->GeneratorPlatform = value;
      havePlatform = true;
    } else if (arg.find("-T", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No toolset specified for -T");
          return;
        }
        value = args[i];
      }
      if (haveToolset) {
        cmSystemTools::Error("Multiple -T options not allowed");
        return;
      }
      this->GeneratorToolset = value;
      haveToolset = true;
    } else if (arg.find("-G", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return;
        }
        value = args[i];
      }
      cmGlobalGenerator* gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        cmSystemTools::Error("Could not create named generator ",
                             value.c_str());
        this->PrintGeneratorList();
      } else {
        this->SetGlobalGenerator(gen);
      }
    }
    // no option assume it is the path to the source
    else {
      directoriesSet = true;
      this->SetDirectoriesFromFile(arg.c_str());
    }
  }